

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

bool llvm::consumeSignedInteger(StringRef *Str,uint Radix,longlong *Result)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auStack_40 [8];
  StringRef Str2;
  unsigned_long_long ULLVal;
  
  if ((Str->Length != 0) && (cVar1 = StringRef::front(Str), cVar1 == '-')) {
    _auStack_40 = StringRef::drop_front(Str,1);
    bVar2 = consumeUnsignedInteger((StringRef *)auStack_40,Radix,&Str2.Length);
    bVar3 = 0x8000000000000000 < Str2.Length || bVar2;
    if (0x8000000000000000 < Str2.Length || bVar2) {
      return bVar3;
    }
    Str->Data = (char *)auStack_40;
    Str->Length = (size_t)Str2.Data;
    *Result = -Str2.Length;
    return bVar3;
  }
  bVar2 = consumeUnsignedInteger(Str,Radix,&Str2.Length);
  if (-1 < (long)Str2.Length && !bVar2) {
    *Result = Str2.Length;
  }
  return -1 >= (long)Str2.Length || bVar2;
}

Assistant:

bool llvm::consumeSignedInteger(StringRef &Str, unsigned Radix,
                                long long &Result) {
  unsigned long long ULLVal;

  // Handle positive strings first.
  if (Str.empty() || Str.front() != '-') {
    if (consumeUnsignedInteger(Str, Radix, ULLVal) ||
        // Check for value so large it overflows a signed value.
        (long long)ULLVal < 0)
      return true;
    Result = ULLVal;
    return false;
  }

  // Get the positive part of the value.
  StringRef Str2 = Str.drop_front(1);
  if (consumeUnsignedInteger(Str2, Radix, ULLVal) ||
      // Reject values so large they'd overflow as negative signed, but allow
      // "-0".  This negates the unsigned so that the negative isn't undefined
      // on signed overflow.
      (long long)-ULLVal > 0)
    return true;

  Str = Str2;
  Result = -ULLVal;
  return false;
}